

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O3

void __thiscall KDReports::Test::testVerticalHeader(Test *this)

{
  int iVar1;
  QFont *pQVar2;
  AutoTableElement *pAVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  AutoTableElement tableElement;
  Report report;
  QFont aQStack_98 [16];
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  Report local_40 [24];
  QByteArrayView local_28;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(local_40,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_40);
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  QByteArrayView::QByteArrayView<char,_true>(&local_28,"Noto Sans",9);
  QVar4.m_data = (storage_type *)local_28.m_size;
  QVar4.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar4);
  local_88.ptr = local_68.ptr;
  local_88.d = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_88.size = local_68.size;
  local_68.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFont::QFont(aQStack_98,(QString *)&local_88,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_40);
  QFont::~QFont(aQStack_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  pQVar2 = (QFont *)KDReports::Report::mainTable();
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  QByteArrayView::QByteArrayView<char,_true>(&local_28,"courier",7);
  QVar5.m_data = (storage_type *)local_28.m_size;
  QVar5.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar5);
  local_88.ptr = local_68.ptr;
  local_88.d = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_88.size = local_68.size;
  local_68.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFont::QFont(aQStack_98,(QString *)&local_88,0x1e,-1,false);
  KDReports::MainTable::setVerticalHeaderFont(pQVar2);
  QFont::~QFont(aQStack_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_68,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_68,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar3 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar3);
  iVar1 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar1,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1b1);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_68);
  KDReports::Report::~Report(local_40);
  return;
}

Assistant:

void testVerticalHeader()
    {
        // Check that the font for vertical headers is taken into account
        // in the layouting.
        // For that, we make it huge, and we check that the report takes two pages.
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        report.mainTable()->setVerticalHeaderFont(QFont(QLatin1String("courier"), 30));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
    }